

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

tuple pybind11::make_tuple<(pybind11::return_value_policy)1,char_const(&)[9]>(char (*args_) [9])

{
  bool bVar1;
  handle __val;
  size_type sVar2;
  handle *this;
  undefined8 uVar3;
  iterator pvVar4;
  iterator pvVar5;
  PyObject **ppPVar6;
  string *in_RSI;
  object in_RDI;
  value_type *arg_value;
  iterator __end0;
  iterator __begin0;
  array<pybind11::object,_1UL> *__range2;
  int counter;
  size_t i;
  array<pybind11::object,_1UL> args;
  size_t size;
  tuple *result;
  object *in_stack_fffffffffffffef8;
  array<pybind11::object,_1UL> *in_stack_ffffffffffffff00;
  PyTypeObject *pPVar7;
  handle in_stack_ffffffffffffff08;
  array<pybind11::object,_1UL> *in_stack_ffffffffffffff10;
  unsigned_long in_stack_ffffffffffffff18;
  tuple *in_stack_ffffffffffffff20;
  handle local_a0;
  undefined8 in_stack_ffffffffffffff68;
  return_value_policy policy;
  char *in_stack_ffffffffffffff70;
  handle in_stack_ffffffffffffff78;
  int local_78;
  ulong local_50;
  handle local_38;
  PyObject *local_30;
  array<pybind11::object,_1UL> *local_28;
  array<pybind11::object,_1UL> local_20;
  undefined8 local_18;
  
  policy = (return_value_policy)((ulong)in_stack_ffffffffffffff68 >> 0x38);
  local_18 = 1;
  local_28 = &local_20;
  handle::handle<std::nullptr_t,_0>(&local_38,(void *)0x0);
  __val = detail::type_caster<char,_void>::cast
                    (in_stack_ffffffffffffff70,policy,in_stack_ffffffffffffff78);
  local_30 = __val.m_ptr;
  reinterpret_steal<pybind11::object>(in_stack_ffffffffffffff08);
  local_50 = 0;
  while( true ) {
    sVar2 = std::array<pybind11::object,_1UL>::size(&local_20);
    if (sVar2 <= local_50) {
      tuple::tuple<unsigned_long,_0>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      local_78 = 0;
      pvVar4 = std::array<pybind11::object,_1UL>::begin((array<pybind11::object,_1UL> *)0x133424);
      pvVar5 = std::array<pybind11::object,_1UL>::end((array<pybind11::object,_1UL> *)0x133439);
      for (; pvVar4 != pvVar5; pvVar4 = pvVar4 + 1) {
        local_a0 = object::release(in_stack_fffffffffffffef8);
        ppPVar6 = handle::ptr(&local_a0);
        pPVar7 = (PyTypeObject *)*ppPVar6;
        ppPVar6 = handle::ptr((handle *)in_RDI.super_handle.m_ptr);
        (&(*ppPVar6)[1].ob_type)[local_78] = pPVar7;
        local_78 = local_78 + 1;
      }
      std::array<pybind11::object,_1UL>::~array(in_stack_ffffffffffffff10);
      return (tuple)in_RDI.super_handle.m_ptr;
    }
    this = &std::array<pybind11::object,_1UL>::operator[]
                      (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8)->super_handle
    ;
    bVar1 = handle::operator_cast_to_bool(this);
    if (!bVar1) break;
    local_50 = local_50 + 1;
  }
  uVar3 = __cxa_allocate_exception(0x10);
  std::__cxx11::to_string((unsigned_long)__val.m_ptr);
  cast_error_unable_to_convert_call_arg(in_RSI);
  __cxa_throw(uVar3,&cast_error::typeinfo,cast_error::~cast_error);
}

Assistant:

tuple make_tuple(Args &&...args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args{{reinterpret_steal<object>(
        detail::make_caster<Args>::cast(std::forward<Args>(args_), policy, nullptr))...}};
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if !defined(PYBIND11_DETAILED_ERROR_MESSAGES)
            throw cast_error_unable_to_convert_call_arg(std::to_string(i));
#else
            std::array<std::string, size> argtypes{{type_id<Args>()...}};
            throw cast_error_unable_to_convert_call_arg(std::to_string(i), argtypes[i]);
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args) {
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    }
    return result;
}